

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void add_intrinsic_f_Vf(Context_conflict *ctx,char *fn)

{
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_astDataType *dt_2;
  MOJOSHADER_astDataType *dt_1;
  MOJOSHADER_astDataType *dt;
  char *fn_local;
  Context_conflict *ctx_local;
  
  pMVar1 = get_usertype(ctx,"float1");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"float2");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"float3");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"float4");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"half1");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"half2");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"half3");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"half4");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"double1");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"double2");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"double3");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  pMVar1 = get_usertype(ctx,"double4");
  add_intrinsic1(ctx,fn,(MOJOSHADER_astDataType *)((pMVar1->structure).members)->identifier,pMVar1);
  return;
}

Assistant:

static void add_intrinsic_f_Vf(Context *ctx, const char *fn)
{
    ADD_INTRINSIC_VECTOR_FLOAT(add_intrinsic1(ctx, fn, dt->user.details->vector.base, dt));
}